

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  cmake *pcVar4;
  reference pbVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  pointer pcVar10;
  char *m1;
  __type local_2a2;
  bool local_2a1;
  string local_290 [32];
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_270;
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_268;
  const_iterator i_1;
  string temp;
  undefined1 local_238 [7];
  bool expand;
  ostringstream msg;
  string local_b8;
  long local_98;
  size_type pos;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  const_iterator i;
  bool trace;
  string local_70;
  string *local_50;
  string *only_filename;
  string *local_28;
  string *full_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *trace_only_this_files;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  trace_only_this_files =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)lff;
  lff_local = (cmListFileFunction *)this;
  pcVar4 = GetCMakeInstance(this);
  full_path = (string *)cmake::GetTraceSources_abi_cxx11_(pcVar4);
  GetExecutionFilePath_abi_cxx11_((string *)&only_filename,this);
  local_28 = (string *)&only_filename;
  cmsys::SystemTools::GetFilenameName(&local_70,(string *)&only_filename);
  local_50 = &local_70;
  i._M_current._3_1_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)full_path);
  if (!(bool)i._M_current._3_1_) {
    local_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)full_path);
    while( true ) {
      local_2a1 = false;
      if ((i._M_current._3_1_ & 1) == 0) {
        pos = (size_type)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)full_path);
        local_2a1 = __gnu_cxx::operator!=
                              (&local_88,
                               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&pos);
      }
      psVar1 = local_28;
      if (local_2a1 == false) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_88);
      lVar6 = std::__cxx11::string::rfind((string *)psVar1,(ulong)pbVar5);
      bVar2 = false;
      local_2a2 = false;
      local_98 = lVar6;
      if (lVar6 != -1) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_88);
        lVar7 = std::__cxx11::string::size();
        lVar8 = std::__cxx11::string::size();
        psVar1 = local_50;
        local_2a2 = false;
        if (lVar6 + lVar7 == lVar8) {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_88);
          cmsys::SystemTools::GetFilenameName(&local_b8,pbVar5);
          bVar2 = true;
          local_2a2 = std::operator==(psVar1,&local_b8);
        }
      }
      i._M_current._3_1_ = local_2a2;
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_b8);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_88);
    }
    if ((i._M_current._3_1_ & 1) == 0) goto LAB_007594eb;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  poVar9 = std::operator<<((ostream *)local_238,(string *)local_28);
  poVar9 = std::operator<<(poVar9,"(");
  poVar9 = (ostream *)
           std::ostream::operator<<
                     (poVar9,(long)trace_only_this_files[1].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
  std::operator<<(poVar9,"):  ");
  poVar9 = std::operator<<((ostream *)local_238,(string *)trace_only_this_files);
  std::operator<<(poVar9,"(");
  pcVar4 = GetCMakeInstance(this);
  bVar2 = cmake::GetTraceExpand(pcVar4);
  std::__cxx11::string::string((string *)&i_1);
  local_268._M_current =
       (cmListFileArgument *)
       std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin
                 ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                  &trace_only_this_files[1].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_270._M_current =
         (cmListFileArgument *)
         std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end
                   ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                    &trace_only_this_files[1].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = __gnu_cxx::operator!=(&local_268,&local_270);
    if (!bVar3) break;
    if (bVar2) {
      pcVar10 = __gnu_cxx::
                __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                ::operator->(&local_268);
      std::__cxx11::string::operator=((string *)&i_1,(string *)pcVar10);
      ExpandVariablesInString(this,(string *)&i_1);
      std::operator<<((ostream *)local_238,(string *)&i_1);
    }
    else {
      pcVar10 = __gnu_cxx::
                __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                ::operator->(&local_268);
      std::operator<<((ostream *)local_238,(string *)pcVar10);
    }
    std::operator<<((ostream *)local_238," ");
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&local_268);
  }
  std::operator<<((ostream *)local_238,")");
  std::__cxx11::ostringstream::str();
  m1 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::Message(m1,(char *)0x0);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string((string *)&i_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
LAB_007594eb:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&only_filename);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = this->GetExecutionFilePath();
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::vector<std::string>::const_iterator i =
           trace_only_this_files.begin();
         !trace && i != trace_only_this_files.end(); ++i) {
      std::string::size_type const pos = full_path.rfind(*i);
      trace = (pos != std::string::npos) &&
        ((pos + i->size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(*i));
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  msg << full_path << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for (std::vector<cmListFileArgument>::const_iterator i =
         lff.Arguments.begin();
       i != lff.Arguments.end(); ++i) {
    if (expand) {
      temp = i->Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
    } else {
      msg << i->Value;
    }
    msg << " ";
  }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}